

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O2

void proto2_unittest::TestRedactedMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *pAVar5;
  Arena *arena;
  TestRedactedMessage *_this;
  TestRedactedMessage *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestRedactedMessage *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestRedactedMessage_const*,proto2_unittest::TestRedactedMessage*>
                          ((TestRedactedMessage **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)uVar1 != '\0') {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.text_field_,(string *)(uVar2 & 0xfffffffffffffffc),
                   pAVar5);
      }
      if ((uVar1 & 2) != 0) {
        pp_Var3 = from_msg[2]._vptr_MessageLite;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.meta_annotated_,
                   (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 4) != 0) {
        uVar2 = from_msg[2]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.repeated_meta_annotated_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 8) != 0) {
        pp_Var3 = from_msg[3]._vptr_MessageLite;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 8;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.unredacted_repeated_annotations_,
                   (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 0x10) != 0) {
        uVar2 = from_msg[3]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 0x10;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.unreported_non_meta_debug_redact_field_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 0x20) != 0) {
        pp_Var3 = from_msg[4]._vptr_MessageLite;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 0x20;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.redactable_false_,
                   (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 0x40) != 0) {
        uVar2 = from_msg[4]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 0x40;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.test_direct_message_enum_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((char)uVar1 < '\0') {
        pp_Var3 = from_msg[5]._vptr_MessageLite;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 0x80;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.test_nested_message_enum_,
                   (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
      }
    }
    if ((uVar1 & 0x300) != 0) {
      if ((uVar1 >> 8 & 1) != 0) {
        uVar2 = from_msg[5]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 0x100;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.test_redacted_message_enum_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 >> 9 & 1) != 0) {
        from_msg_00 = (MessageLite *)from_msg[6]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.any_field_ != nullptr";
          line = 0x789;
          goto LAB_00a7b02a;
        }
        to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x50);
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<google::protobuf::Any>(arena,from_msg_00);
          *(void **)((long)&local_30->field_0 + 0x50) = pvVar4;
        }
        else {
          google::protobuf::Any::MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x765;
LAB_00a7b02a:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_redaction.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestRedactedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRedactedMessage*>(&to_msg);
  auto& from = static_cast<const TestRedactedMessage&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRedactedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_text_field(from._internal_text_field());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_meta_annotated(from._internal_meta_annotated());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_repeated_meta_annotated(from._internal_repeated_meta_annotated());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_unredacted_repeated_annotations(from._internal_unredacted_repeated_annotations());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_unreported_non_meta_debug_redact_field(from._internal_unreported_non_meta_debug_redact_field());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_internal_set_redactable_false(from._internal_redactable_false());
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_internal_set_test_direct_message_enum(from._internal_test_direct_message_enum());
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_internal_set_test_nested_message_enum(from._internal_test_nested_message_enum());
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_internal_set_test_redacted_message_enum(from._internal_test_redacted_message_enum());
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.any_field_ != nullptr);
      if (_this->_impl_.any_field_ == nullptr) {
        _this->_impl_.any_field_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.any_field_);
      } else {
        _this->_impl_.any_field_->MergeFrom(*from._impl_.any_field_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}